

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlFileRead(void *context,char *buffer,int len)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  size_t bytes;
  FILE *file;
  int len_local;
  char *buffer_local;
  void *context_local;
  
  if ((context == (void *)0x0) || (buffer == (char *)0x0)) {
    context_local._4_4_ = -1;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0;
    sVar3 = fread(buffer,1,(long)len,(FILE *)context);
    if ((sVar3 < (ulong)(long)len) && (iVar1 = ferror((FILE *)context), iVar1 != 0)) {
      piVar2 = __errno_location();
      iVar1 = xmlIOErr(*piVar2);
      return -iVar1;
    }
    context_local._4_4_ = (int)sVar3;
  }
  return context_local._4_4_;
}

Assistant:

int
xmlFileRead(void * context, char * buffer, int len) {
    FILE *file = context;
    size_t bytes;

    if ((context == NULL) || (buffer == NULL))
        return(-1);

    /*
     * The C standard doesn't mandate that fread sets errno, only
     * POSIX does. The Windows documentation isn't really clear.
     * Set errno to zero which will be reported as unknown error
     * if fread fails without setting errno.
     */
    errno = 0;
    bytes = fread(buffer, 1, len, file);
    if ((bytes < (size_t) len) && (ferror(file)))
        return(-xmlIOErr(errno));

    return(bytes);
}